

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O1

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  spki_record *psVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (spki_record *)malloc(0x80);
  *(undefined8 *)(psVar2->ski + 0x10) = 0;
  psVar2->spki[0] = '\0';
  psVar2->spki[1] = '\0';
  psVar2->spki[2] = '\0';
  psVar2->spki[3] = '\0';
  psVar2->spki[4] = '\0';
  psVar2->spki[5] = '\0';
  psVar2->spki[6] = '\0';
  psVar2->spki[7] = '\0';
  psVar2->ski[0] = '\0';
  psVar2->ski[1] = '\0';
  psVar2->ski[2] = '\0';
  psVar2->ski[3] = '\0';
  psVar2->ski[4] = '\0';
  psVar2->ski[5] = '\0';
  psVar2->ski[6] = '\0';
  psVar2->ski[7] = '\0';
  psVar2->ski[8] = '\0';
  psVar2->ski[9] = '\0';
  psVar2->ski[10] = '\0';
  psVar2->ski[0xb] = '\0';
  psVar2->ski[0xc] = '\0';
  psVar2->ski[0xd] = '\0';
  psVar2->ski[0xe] = '\0';
  psVar2->ski[0xf] = '\0';
  psVar2->spki[8] = '\0';
  psVar2->spki[9] = '\0';
  psVar2->spki[10] = '\0';
  psVar2->spki[0xb] = '\0';
  psVar2->spki[0xc] = '\0';
  psVar2->spki[0xd] = '\0';
  psVar2->spki[0xe] = '\0';
  psVar2->spki[0xf] = '\0';
  psVar2->spki[0x10] = '\0';
  psVar2->spki[0x11] = '\0';
  psVar2->spki[0x12] = '\0';
  psVar2->spki[0x13] = '\0';
  psVar2->spki[0x14] = '\0';
  psVar2->spki[0x15] = '\0';
  psVar2->spki[0x16] = '\0';
  psVar2->spki[0x17] = '\0';
  psVar2->spki[0x18] = '\0';
  psVar2->spki[0x19] = '\0';
  psVar2->spki[0x1a] = '\0';
  psVar2->spki[0x1b] = '\0';
  psVar2->spki[0x1c] = '\0';
  psVar2->spki[0x1d] = '\0';
  psVar2->spki[0x1e] = '\0';
  psVar2->spki[0x1f] = '\0';
  psVar2->spki[0x20] = '\0';
  psVar2->spki[0x21] = '\0';
  psVar2->spki[0x22] = '\0';
  psVar2->spki[0x23] = '\0';
  psVar2->spki[0x24] = '\0';
  psVar2->spki[0x25] = '\0';
  psVar2->spki[0x26] = '\0';
  psVar2->spki[0x27] = '\0';
  psVar2->spki[0x28] = '\0';
  psVar2->spki[0x29] = '\0';
  psVar2->spki[0x2a] = '\0';
  psVar2->spki[0x2b] = '\0';
  psVar2->spki[0x2c] = '\0';
  psVar2->spki[0x2d] = '\0';
  psVar2->spki[0x2e] = '\0';
  psVar2->spki[0x2f] = '\0';
  psVar2->spki[0x30] = '\0';
  psVar2->spki[0x31] = '\0';
  psVar2->spki[0x32] = '\0';
  psVar2->spki[0x33] = '\0';
  psVar2->spki[0x34] = '\0';
  psVar2->spki[0x35] = '\0';
  psVar2->spki[0x36] = '\0';
  psVar2->spki[0x37] = '\0';
  psVar2->spki[0x38] = '\0';
  psVar2->spki[0x39] = '\0';
  psVar2->spki[0x3a] = '\0';
  psVar2->spki[0x3b] = '\0';
  psVar2->spki[0x3c] = '\0';
  psVar2->spki[0x3d] = '\0';
  psVar2->spki[0x3e] = '\0';
  psVar2->spki[0x3f] = '\0';
  psVar2->spki[0x40] = '\0';
  psVar2->spki[0x41] = '\0';
  psVar2->spki[0x42] = '\0';
  psVar2->spki[0x43] = '\0';
  psVar2->spki[0x44] = '\0';
  psVar2->spki[0x45] = '\0';
  psVar2->spki[0x46] = '\0';
  psVar2->spki[0x47] = '\0';
  psVar2->spki[0x48] = '\0';
  psVar2->spki[0x49] = '\0';
  psVar2->spki[0x4a] = '\0';
  psVar2->spki[0x4b] = '\0';
  psVar2->spki[0x4c] = '\0';
  psVar2->spki[0x4d] = '\0';
  psVar2->spki[0x4e] = '\0';
  psVar2->spki[0x4f] = '\0';
  psVar2->spki[0x50] = '\0';
  psVar2->spki[0x51] = '\0';
  psVar2->spki[0x52] = '\0';
  psVar2->spki[0x53] = '\0';
  psVar2->spki[0x54] = '\0';
  psVar2->spki[0x55] = '\0';
  psVar2->spki[0x56] = '\0';
  psVar2->spki[0x57] = '\0';
  *(undefined8 *)(psVar2->spki + 0x58) = 0;
  psVar2->socket = (rtr_socket *)0x0;
  psVar2->asn = ASN;
  lVar3 = 0;
  do {
    *(int *)(psVar2->ski + lVar3 * 4) = ski_offset + (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0;
  do {
    *(int *)(psVar2->spki + lVar3 * 4) = spki_offset + (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x16);
  psVar2->socket = socket;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	memset(record, 0, sizeof(*record));
	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski) / sizeof(uint32_t); i++)
		((uint32_t *)record->ski)[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki) / sizeof(uint32_t); i++)
		((uint32_t *)record->spki)[i] = i + spki_offset;

	record->socket = socket;
	return record;
}